

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3DropIndex(Parse *pParse,SrcList *pName,int ifExists)

{
  sqlite3 *db_00;
  Table *pTVar1;
  char *zArg3;
  int iVar2;
  int iVar3;
  Index *pIVar4;
  char *zArg1;
  Vdbe *p;
  char *zTab;
  char *zDb;
  Table *pTab;
  int code;
  int iDb;
  sqlite3 *db;
  Vdbe *v;
  Index *pIndex;
  int ifExists_local;
  SrcList *pName_local;
  Parse *pParse_local;
  
  db_00 = pParse->db;
  if ((db_00->mallocFailed == '\0') && (iVar2 = sqlite3ReadSchema(pParse), iVar2 == 0)) {
    pIVar4 = sqlite3FindIndex(db_00,pName->a[0].zName,pName->a[0].zDatabase);
    if (pIVar4 == (Index *)0x0) {
      if (ifExists == 0) {
        sqlite3ErrorMsg(pParse,"no such index: %S",pName,0);
      }
      else {
        sqlite3CodeVerifyNamedSchema(pParse,pName->a[0].zDatabase);
      }
      pParse->checkSchema = '\x01';
    }
    else if ((*(ushort *)&pIVar4->field_0x63 & 3) == 0) {
      iVar2 = sqlite3SchemaToIndex(db_00,pIVar4->pSchema);
      pTab._0_4_ = 10;
      pTVar1 = pIVar4->pTable;
      zArg3 = db_00->aDb[iVar2].zDbSName;
      zArg1 = "sqlite_master";
      if (iVar2 == 1) {
        zArg1 = "sqlite_temp_master";
      }
      iVar3 = sqlite3AuthCheck(pParse,9,zArg1,(char *)0x0,zArg3);
      if (iVar3 == 0) {
        if (iVar2 != 0) {
          pTab._0_4_ = 0xc;
        }
        iVar3 = sqlite3AuthCheck(pParse,(int)pTab,pIVar4->zName,pTVar1->zName,zArg3);
        if ((iVar3 == 0) && (p = sqlite3GetVdbe(pParse), p != (Vdbe *)0x0)) {
          sqlite3BeginWriteOperation(pParse,1,iVar2);
          sqlite3NestedParse(pParse,"DELETE FROM %Q.%s WHERE name=%Q AND type=\'index\'",
                             db_00->aDb[iVar2].zDbSName,"sqlite_master");
          sqlite3ClearStatTables(pParse,iVar2,"idx",pIVar4->zName);
          sqlite3ChangeCookie(pParse,iVar2);
          destroyRootPage(pParse,pIVar4->tnum,iVar2);
          sqlite3VdbeAddOp4(p,0x90,iVar2,0,0,pIVar4->zName,0);
        }
      }
    }
    else {
      sqlite3ErrorMsg(pParse,
                      "index associated with UNIQUE or PRIMARY KEY constraint cannot be dropped",0);
    }
  }
  sqlite3SrcListDelete(db_00,pName);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3DropIndex(Parse *pParse, SrcList *pName, int ifExists){
  Index *pIndex;
  Vdbe *v;
  sqlite3 *db = pParse->db;
  int iDb;

  assert( pParse->nErr==0 );   /* Never called with prior errors */
  if( db->mallocFailed ){
    goto exit_drop_index;
  }
  assert( pName->nSrc==1 );
  if( SQLITE_OK!=sqlite3ReadSchema(pParse) ){
    goto exit_drop_index;
  }
  pIndex = sqlite3FindIndex(db, pName->a[0].zName, pName->a[0].zDatabase);
  if( pIndex==0 ){
    if( !ifExists ){
      sqlite3ErrorMsg(pParse, "no such index: %S", pName, 0);
    }else{
      sqlite3CodeVerifyNamedSchema(pParse, pName->a[0].zDatabase);
    }
    pParse->checkSchema = 1;
    goto exit_drop_index;
  }
  if( pIndex->idxType!=SQLITE_IDXTYPE_APPDEF ){
    sqlite3ErrorMsg(pParse, "index associated with UNIQUE "
      "or PRIMARY KEY constraint cannot be dropped", 0);
    goto exit_drop_index;
  }
  iDb = sqlite3SchemaToIndex(db, pIndex->pSchema);
#ifndef SQLITE_OMIT_AUTHORIZATION
  {
    int code = SQLITE_DROP_INDEX;
    Table *pTab = pIndex->pTable;
    const char *zDb = db->aDb[iDb].zDbSName;
    const char *zTab = SCHEMA_TABLE(iDb);
    if( sqlite3AuthCheck(pParse, SQLITE_DELETE, zTab, 0, zDb) ){
      goto exit_drop_index;
    }
    if( !OMIT_TEMPDB && iDb ) code = SQLITE_DROP_TEMP_INDEX;
    if( sqlite3AuthCheck(pParse, code, pIndex->zName, pTab->zName, zDb) ){
      goto exit_drop_index;
    }
  }
#endif

  /* Generate code to remove the index and from the master table */
  v = sqlite3GetVdbe(pParse);
  if( v ){
    sqlite3BeginWriteOperation(pParse, 1, iDb);
    sqlite3NestedParse(pParse,
       "DELETE FROM %Q.%s WHERE name=%Q AND type='index'",
       db->aDb[iDb].zDbSName, MASTER_NAME, pIndex->zName
    );
    sqlite3ClearStatTables(pParse, iDb, "idx", pIndex->zName);
    sqlite3ChangeCookie(pParse, iDb);
    destroyRootPage(pParse, pIndex->tnum, iDb);
    sqlite3VdbeAddOp4(v, OP_DropIndex, iDb, 0, 0, pIndex->zName, 0);
  }

exit_drop_index:
  sqlite3SrcListDelete(db, pName);
}